

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O1

int codes(state *s,huffman *lencode,huffman *distcode)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  do {
    uVar3 = decode(s,lencode);
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    if ((int)uVar3 < 0x100) {
      if (s->out != (uchar *)0x0) {
        if (s->outcnt == s->outlen) {
          return 1;
        }
        s->out[s->outcnt] = (uchar)uVar3;
      }
      s->outcnt = s->outcnt + 1;
      uVar5 = uVar3;
    }
    else {
      uVar5 = 0x100;
      if (uVar3 != 0x100) {
        if (0x11d < (int)uVar3) {
          return -10;
        }
        sVar1 = codes::lens[uVar3 - 0x101];
        iVar4 = bits(s,(int)codes::lext[uVar3 - 0x101]);
        uVar5 = decode(s,distcode);
        if ((int)uVar5 < 0) {
          return uVar5;
        }
        sVar2 = codes::dists[uVar5];
        iVar6 = bits(s,(int)codes::dext[uVar5]);
        if (s->outcnt < (ulong)(uint)(iVar6 + sVar2)) {
          return -0xb;
        }
        uVar7 = (long)iVar4 + (long)sVar1;
        uVar8 = s->outcnt + uVar7;
        if (s->out == (uchar *)0x0) {
          s->outcnt = uVar8;
        }
        else {
          if (s->outlen < uVar8) {
            return 1;
          }
          uVar3 = (uint)uVar7;
          while (uVar3 != 0) {
            s->out[s->outcnt] = s->out[s->outcnt - (ulong)(uint)(iVar6 + sVar2)];
            s->outcnt = s->outcnt + 1;
            uVar3 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar3;
          }
        }
      }
    }
    if (uVar5 == 0x100) {
      return 0;
    }
  } while( true );
}

Assistant:

local int codes(struct state *s,
                const struct huffman *lencode,
                const struct huffman *distcode)
{
    int symbol;         /* decoded symbol */
    int len;            /* length for copy */
    unsigned dist;      /* distance for copy */
    static const short lens[29] = { /* Size base for length codes 257..285 */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258};
    static const short lext[29] = { /* Extra bits for length codes 257..285 */
        0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 1, 1, 2, 2, 2, 2,
        3, 3, 3, 3, 4, 4, 4, 4, 5, 5, 5, 5, 0};
    static const short dists[30] = { /* Offset base for distance codes 0..29 */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577};
    static const short dext[30] = { /* Extra bits for distance codes 0..29 */
        0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6,
        7, 7, 8, 8, 9, 9, 10, 10, 11, 11,
        12, 12, 13, 13};

    /* decode literals and length/distance pairs */
    do {
        symbol = decode(s, lencode);
        if (symbol < 0)
            return symbol;              /* invalid symbol */
        if (symbol < 256) {             /* literal: symbol is the byte */
            /* write out the literal */
            if (s->out != nullptr) {
                if (s->outcnt == s->outlen)
                    return 1;
                s->out[s->outcnt] = symbol;
            }
            s->outcnt++;
        }
        else if (symbol > 256) {        /* length */
            /* get and compute length */
            symbol -= 257;
            if (symbol >= 29)
                return -10;             /* invalid fixed code */
            len = lens[symbol] + bits(s, lext[symbol]);

            /* get and check distance */
            symbol = decode(s, distcode);
            if (symbol < 0)
                return symbol;          /* invalid symbol */
            dist = dists[symbol] + bits(s, dext[symbol]);
#ifndef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
            if (dist > s->outcnt)
                return -11;     /* distance too far back */
#endif

            /* copy length bytes from distance bytes back */
            if (s->out != nullptr) {
                if (s->outcnt + len > s->outlen)
                    return 1;
                while (len--) {
                    s->out[s->outcnt] =
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        dist > s->outcnt ?
                            0 :
#endif
                            s->out[s->outcnt - dist];
                    s->outcnt++;
                }
            }
            else
                s->outcnt += len;
        }
    } while (symbol != 256);            /* end of block symbol */

    /* done with a valid fixed or dynamic block */
    return 0;
}